

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffedit_columns(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  void *__ptr;
  undefined8 uVar11;
  char *pcVar12;
  fitsfile *pfVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  int colnum;
  char *file_expr;
  char *clause;
  int tstatus;
  char *tstbuff;
  int numcols;
  int testnum;
  int hdunum;
  int status_del;
  char *cptr3;
  fitsfile *newptr;
  char colname [71];
  char oldname [71];
  char colformat [71];
  char testname [71];
  char keyname [75];
  char card [81];
  int local_284;
  char *local_280;
  char *local_278;
  int local_26c;
  char *local_268;
  uint local_260;
  int local_25c;
  char *local_258;
  int local_24c;
  int local_248;
  int local_244;
  undefined8 local_240;
  char *local_238;
  int local_22c;
  char *local_228;
  undefined8 local_220;
  char local_218 [72];
  void *local_1d0;
  char local_1c8 [80];
  char local_178 [79];
  char acStack_129 [81];
  char local_d8 [80];
  char local_88 [88];
  
  local_284 = -1;
  local_260 = 0;
  local_26c = 0;
  local_268 = (char *)0x0;
  local_278 = (char *)0x0;
  local_280 = (char *)0x0;
  if (*outfile == '\0') {
LAB_00113a66:
    for (pcVar12 = expr + 4; *pcVar12 == ' '; pcVar12 = pcVar12 + 1) {
    }
    if (*pcVar12 == '@') {
      local_238 = pcVar12;
      iVar5 = ffimport_file(pcVar12 + 1,&local_280,status);
      if (iVar5 != 0) goto LAB_00113a52;
      pcVar9 = local_280 + -1;
      do {
        pcVar12 = pcVar9 + 1;
        pcVar14 = pcVar9 + 1;
        pcVar9 = pcVar12;
      } while (*pcVar14 == ' ');
    }
    local_26c = 0;
    local_238 = pcVar12;
    ffgncl(*fptr,(int *)&local_260,&local_26c);
    iVar5 = comma2semicolon(pcVar12);
    if (iVar5 != 0) {
      ffpmsg("parsing error in column filter expression");
      ffpmsg(pcVar12);
      if (local_280 != (char *)0x0) {
        free(local_280);
      }
      *status = 0x1af;
      return 0x1af;
    }
    local_240 = 0;
    uVar6 = fits_get_token2(&local_238,";",&local_278,(int *)0x0,status);
    if ((int)uVar6 < 1) {
      bVar4 = false;
      __ptr = (void *)0x0;
    }
    else {
      __ptr = (void *)0x0;
      local_24c = 0;
      do {
        pcVar12 = local_278;
        if (*local_238 == ';') {
          local_238 = local_238 + 1;
        }
        local_278[uVar6] = '\0';
        if ((*local_278 == '-') || (*local_278 == '!')) {
          pcVar9 = local_278 + 1;
          cVar2 = local_278[1];
          if (cVar2 == '\0') {
            uVar6 = 0;
          }
          else {
            sVar8 = strlen(pcVar9);
            uVar6 = (uint)sVar8;
          }
          if ((((cVar2 == '#') || (*status != 0)) || ((int)uVar6 < 2)) || (pcVar12[uVar6] != '+')) {
            if (((cVar2 == '\0') || (cVar2 == '#')) ||
               ((iVar5 = ffgcno(*fptr,0,pcVar9,&local_284,status), 0 < iVar5 && (*status != 0xed))))
            {
              ffcmsg();
              *status = 0;
              pcVar14 = pcVar12 + 2;
              pcVar1 = pcVar12 + 1;
              pcVar12 = pcVar9;
              if (*pcVar1 == '#') {
                pcVar12 = pcVar14;
              }
              sVar8 = strlen(pcVar12);
              bVar4 = false;
              if ((1 < (int)sVar8) && (uVar6 = (int)sVar8 - 1, pcVar12[uVar6] == '+')) {
                pcVar12[uVar6] = '\0';
                bVar4 = true;
              }
              pcVar9 = strchr(pcVar12,0x3f);
              if (((pcVar9 != (char *)0x0) || (pcVar9 = strchr(pcVar12,0x2a), pcVar9 != (char *)0x0)
                  ) || (pcVar9 = strchr(pcVar12,0x23), iVar5 = local_248, pcVar9 != (char *)0x0)) {
                ffmaky(*fptr,1,status);
                iVar5 = local_248;
              }
              do {
                iVar7 = ffdkey(*fptr,pcVar12,status);
                bVar3 = bVar4;
                if (0 < iVar7) {
                  if ((!bVar4) || (*status != 0xca)) {
                    ffpmsg("column or keyword to be deleted does not exist:");
                    goto LAB_00113f48;
                  }
                  ffcmsg();
                  *status = 0;
                  bVar3 = false;
                }
                bVar4 = true;
              } while (bVar3);
              goto LAB_00113f93;
            }
            *status = 0;
            iVar5 = ffdcol(*fptr,local_284,status);
            if (iVar5 < 1) {
              local_260 = local_260 - 1;
              local_284 = -1;
              bVar4 = true;
              local_24c = 1;
            }
            else {
              ffpmsg("failed to delete column in input file:");
LAB_00113f48:
              ffpmsg(pcVar12);
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              if (local_280 != (char *)0x0) {
                free(local_280);
              }
              if (local_278 != (char *)0x0) {
                free(local_278);
              }
              local_248 = *status;
              bVar4 = false;
            }
          }
          else {
            pcVar12[uVar6] = '\0';
            iVar5 = local_248;
            do {
              bVar4 = false;
              local_22c = 0;
              *status = 0;
              ffgcno(*fptr,0,pcVar9,&local_284,status);
              if ((*status == 0xed) || (*status == 0)) {
                iVar7 = ffdcol(*fptr,local_284,&local_22c);
                if (iVar7 < 1) {
                  local_260 = local_260 - 1;
                  iVar7 = 0;
                  bVar4 = true;
                  local_24c = 1;
                }
                else {
                  ffpmsg("failed to delete column in input file:");
                  ffpmsg(local_278);
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                  if (local_280 != (char *)0x0) {
                    free(local_280);
                  }
                  if (local_278 != (char *)0x0) {
                    free(local_278);
                  }
                  *status = local_22c;
                  iVar7 = 1;
                  bVar4 = false;
                  iVar5 = local_22c;
                }
              }
              else {
                iVar7 = 0xb;
              }
              if (iVar7 != 0) {
                local_248 = iVar5;
                if (iVar7 != 0xb) goto LAB_00113f96;
                break;
              }
            } while (*status == 0xed);
            *status = 0;
            local_284 = -1;
LAB_00113f93:
            bVar4 = true;
            local_248 = iVar5;
          }
LAB_00113f96:
          if (!bVar4) {
            return local_248;
          }
        }
        else {
          local_258 = local_278;
          iVar5 = fits_get_token2(&local_258,"( =",&local_268,(int *)0x0,status);
          pcVar9 = local_268;
          if ((iVar5 == 0) || (*status != 0)) {
            ffpmsg("error: column or keyword name is blank (ffedit_columns):");
            ffpmsg(pcVar12);
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (local_280 != (char *)0x0) {
              free(local_280);
            }
            if (local_278 != (char *)0x0) {
              free(local_278);
            }
            if (*status == 0) {
              *status = 0x7d;
            }
            goto LAB_00113a52;
          }
          sVar8 = strlen(local_268);
          if (0x46 < sVar8) {
            ffpmsg("error: column or keyword name is too long (ffedit_columns):");
LAB_001145e5:
            ffpmsg(pcVar12);
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (local_280 != (char *)0x0) {
              free(local_280);
            }
            pcVar12 = local_268;
            if (local_278 != (char *)0x0) {
              free(local_278);
              pcVar12 = local_268;
            }
LAB_001146ee:
            free(pcVar12);
LAB_001146f3:
            *status = 0x7d;
            return 0x7d;
          }
          strcpy(local_218,pcVar9);
          free(pcVar9);
          local_268 = (char *)0x0;
          if (local_218[0] == '#') {
            pcVar9 = strchr(local_218 + 1,0x23);
            sVar8 = strlen(local_218);
            if (pcVar9 != (char *)((long)&local_220 + sVar8 + 7)) goto LAB_00113c2a;
            if (0 < local_284) {
              *(undefined1 *)((long)&local_220 + sVar8 + 7) = 0;
              pcVar9 = local_218 + 1;
              ffkeyn(pcVar9,local_284,local_1c8,status);
              if (*status != 0) {
                return *status;
              }
LAB_00114028:
              strcpy(pcVar9,local_1c8);
              goto LAB_00114030;
            }
            ffpmsg("The keyword name:");
            ffpmsg(local_218);
            ffpmsg("is invalid unless a column has been previously");
            ffpmsg("created or editted by a calculator command");
            if (local_280 != (char *)0x0) {
              free(local_280);
            }
            goto LAB_001146ee;
          }
LAB_00113c2a:
          pcVar9 = strchr(local_218,0x23);
          sVar8 = strlen(local_218);
          if ((pcVar9 == (char *)((long)&local_220 + sVar8 + 7)) && (0 < local_284)) {
            local_26c = 0;
            ffgcno(*fptr,0,local_218,&local_25c,&local_26c);
            if ((local_26c != 0) && (local_26c != 0xed)) {
              ffcmsg();
              pcVar14 = acStack_129 + 1;
              pcVar9 = local_218;
              strcpy(pcVar14,pcVar9);
              sVar8 = strlen(pcVar14);
              pcVar14[sVar8 - 1] = '\0';
              ffkeyn(pcVar14,local_284,local_1c8,status);
              if (*status != 0) {
                if (local_280 != (char *)0x0) {
                  free(local_280);
                }
                goto LAB_00114552;
              }
              local_26c = 0;
              iVar5 = ffgcrd(*fptr,local_1c8,local_88,&local_26c);
              if (iVar5 == 0) goto LAB_00114028;
            }
          }
LAB_00114030:
          if (*local_258 == '(') {
            iVar5 = fits_get_token2(&local_258,")",&local_268,(int *)0x0,status);
            pcVar9 = local_268;
            if (iVar5 == 0) {
              sVar8 = strlen(local_218);
              (local_218 + sVar8)[0] = ')';
              (local_218 + sVar8)[1] = '\0';
LAB_001140e1:
              local_258 = local_258 + 1;
              goto LAB_001140e6;
            }
            local_1d0 = __ptr;
            sVar8 = strlen(local_268);
            sVar10 = strlen(local_218);
            if (0xffffffffffffffb8 < (sVar10 + sVar8) - 0x46) {
              strcat(local_218,pcVar9);
              sVar8 = strlen(local_218);
              (local_218 + sVar8)[0] = ')';
              (local_218 + sVar8)[1] = '\0';
              free(pcVar9);
              local_268 = (char *)0x0;
              __ptr = local_1d0;
              goto LAB_001140e1;
            }
            pcVar14 = "error: column name is too long (ffedit_columns):";
LAB_001146cf:
            ffpmsg(pcVar14);
            if (local_280 != (char *)0x0) {
              free(local_280);
            }
            free(pcVar12);
            pcVar12 = pcVar9;
            goto LAB_001146ee;
          }
LAB_001140e6:
          do {
            pcVar14 = local_258;
            pcVar9 = pcVar14 + 1;
            local_258 = pcVar9;
          } while (*pcVar14 == ' ');
          if (*pcVar14 == '=') {
            if (*pcVar9 == '=') {
              pcVar9 = pcVar14 + 2;
              do {
                local_258 = pcVar9;
                pcVar9 = local_258 + 1;
              } while (*local_258 == ' ');
              iVar5 = fits_get_token2(&local_258," ",&local_268,(int *)0x0,status);
              pcVar9 = local_268;
              if (iVar5 == 0) {
                local_1c8[0] = '\0';
              }
              else {
                sVar8 = strlen(local_268);
                if (0x46 < sVar8) {
                  pcVar14 = "error: column name syntax is too long (ffedit_columns):";
                  goto LAB_001146cf;
                }
                strcpy(local_1c8,pcVar9);
                free(pcVar9);
                local_268 = (char *)0x0;
              }
              iVar5 = ffgcno(*fptr,0,local_1c8,&local_284,status);
              if (iVar5 < 1) {
                ffkeyn("TTYPE",local_284,local_d8,status);
                iVar5 = ffmkys(*fptr,local_d8,local_218,(char *)0x0,status);
                if (iVar5 < 1) {
                  if (__ptr == (void *)0x0) {
                    __ptr = calloc(999,4);
                  }
                  *(undefined4 *)((long)__ptr + (long)local_284 * 4 + -4) = 1;
                  goto LAB_00114414;
                }
                ffpmsg("failed to rename column in input file");
                ffpmsg(" oldname =");
                ffpmsg(local_1c8);
                ffpmsg(" newname =");
                pcVar12 = local_218;
              }
              else {
                ffcmsg();
                *status = 0;
                iVar5 = ffmnam(*fptr,local_1c8,local_218,status);
                if (iVar5 < 1) goto LAB_00113fa7;
                ffpmsg("column or keyword to be renamed does not exist:");
              }
            }
            else {
              local_178[0] = '\0';
              local_228 = local_218;
              iVar5 = fits_get_token2(&local_228,"(",&local_268,(int *)0x0,status);
              pcVar12 = local_268;
              if (iVar5 != 0) {
                sVar8 = strlen(local_268);
                if (sVar8 < 0x47) {
                  strcpy(local_1c8,pcVar12);
                  free(pcVar12);
                  local_268 = (char *)0x0;
                  goto LAB_00114341;
                }
LAB_0011467a:
                pcVar12 = "column expression is too long (ffedit_columns)";
                goto LAB_001145e5;
              }
              local_1c8[0] = '\0';
LAB_00114341:
              if (*local_228 == '(') {
                local_228 = local_228 + 1;
                iVar5 = fits_get_token2(&local_228,")",&local_268,(int *)0x0,status);
                pcVar12 = local_268;
                if (iVar5 == 0) {
                  local_178[0] = '\0';
                }
                else {
                  sVar8 = strlen(local_268);
                  if (0x46 < sVar8) goto LAB_0011467a;
                  strcpy(local_178,pcVar12);
                  free(pcVar12);
                  local_268 = (char *)0x0;
                }
              }
              iVar5 = ffcalc(*fptr,pcVar9,*fptr,local_1c8,local_178,status);
              if (iVar5 < 1) {
                local_26c = 0;
                ffgcno(*fptr,0,local_1c8,&local_25c,&local_26c);
                if (local_26c == 0) {
                  lVar15 = (long)local_25c;
                  local_284 = local_25c;
                  if (__ptr == (void *)0x0) {
                    __ptr = calloc(999,4);
                  }
                  *(undefined4 *)((long)__ptr + lVar15 * 4 + -4) = 1;
                  local_240 = 1;
                  if ((int)local_260 < local_284) {
                    local_260 = local_260 + 1;
                  }
                }
                else {
                  ffcmsg();
                }
                goto LAB_00113fa7;
              }
              pcVar12 = "Unable to calculate expression";
            }
            ffpmsg(pcVar12);
            goto joined_r0x001145c8;
          }
          local_258 = pcVar14;
          ffgcno(*fptr,0,local_218,&local_25c,status);
          iVar5 = *status;
          uVar11 = local_240;
          if (iVar5 == 0xed) {
            do {
              lVar15 = (long)local_25c;
              local_284 = local_25c;
              if (__ptr == (void *)0x0) {
                __ptr = calloc(999,4);
              }
              *(undefined4 *)((long)__ptr + lVar15 * 4 + -4) = 1;
              ffgcno(*fptr,0,local_218,&local_25c,status);
              if (*status == 0xdb) {
                *status = 999;
              }
              iVar5 = *status;
            } while (iVar5 == 0xed);
            uVar11 = 1;
          }
          if (iVar5 < 1) {
            lVar15 = (long)local_25c;
            local_284 = local_25c;
            if (__ptr == (void *)0x0) {
              __ptr = calloc(999,4);
            }
            *(undefined4 *)((long)__ptr + lVar15 * 4 + -4) = 1;
LAB_00114414:
            local_240 = 1;
          }
          else {
            if (iVar5 != 999) {
              ffpmsg("Syntax error in columns specifier in input URL:");
              ffpmsg(pcVar14);
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              if (local_280 != (char *)0x0) {
                free(local_280);
              }
              pcVar12 = local_278;
              if (local_278 == (char *)0x0) goto LAB_001146f3;
              goto LAB_001146ee;
            }
            *status = 0;
            local_240 = uVar11;
          }
        }
LAB_00113fa7:
        if (local_278 != (char *)0x0) {
          free(local_278);
        }
        local_278 = (char *)0x0;
        uVar6 = fits_get_token2(&local_238,";",&local_278,(int *)0x0,status);
      } while (0 < (int)uVar6);
      bVar4 = local_24c == 0 && (int)local_240 != 0;
    }
    if ((bool)(0 < (int)local_260 & bVar4)) {
      uVar16 = (ulong)local_260;
      do {
        if ((*(int *)((long)__ptr + uVar16 * 4 + -4) == 0) &&
           (iVar5 = ffdcol(*fptr,(int)uVar16,status), 0 < iVar5)) {
          ffpmsg("failed to delete column in input file:");
          ffpmsg(local_278);
          break;
        }
        bVar4 = 1 < (long)uVar16;
        uVar16 = uVar16 - 1;
      } while (bVar4);
    }
joined_r0x001145c8:
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if (local_280 != (char *)0x0) {
      free(local_280);
    }
    pcVar12 = local_278;
    if (local_278 != (char *)0x0) {
LAB_00114552:
      free(pcVar12);
    }
  }
  else {
    iVar5 = ffinit((fitsfile **)&local_220,outfile,status);
    if (iVar5 < 1) {
      ffghdn(*fptr,&local_244);
      if ((*fptr)->Fptr->only_one == 0) {
        iVar5 = ffmahd(*fptr,1,(int *)0x0,status);
        pfVar13 = local_220;
        if (iVar5 < 1) {
          iVar5 = 2;
          do {
            ffcopy(*fptr,pfVar13,0,status);
            iVar7 = ffmahd(*fptr,iVar5,(int *)0x0,status);
            iVar5 = iVar5 + 1;
          } while (iVar7 < 1);
        }
        if (*status == 0x6b) {
          *status = 0;
        }
        else {
          pfVar13 = local_220;
          if (0 < *status) goto LAB_00113a10;
        }
      }
      else {
        ffmahd(*fptr,1,(int *)0x0,status);
        pfVar13 = local_220;
        ffcopy(*fptr,local_220,0,status);
        ffmahd(*fptr,local_244,(int *)0x0,status);
        ffcopy(*fptr,pfVar13,0,status);
        if (0 < *status) {
LAB_00113a10:
          ffclos(pfVar13,status);
          pcVar12 = "failed to copy all HDUs from input file (ffedit_columns)";
          goto LAB_00113a4d;
        }
        local_244 = 2;
      }
      ffclos(*fptr,status);
      *fptr = local_220;
      iVar5 = ffmahd(local_220,local_244,(int *)0x0,status);
      if (iVar5 < 1) goto LAB_00113a66;
      pcVar12 = "failed to copy the input file (ffedit_columns)";
    }
    else {
      pcVar12 = "failed to create file for copy (ffedit_columns)";
    }
LAB_00113a4d:
    ffpmsg(pcVar12);
  }
LAB_00113a52:
  return *status;
}

Assistant:

int ffedit_columns(
           fitsfile **fptr,  /* IO - pointer to input table; on output it  */
                             /*      points to the new selected rows table */
           char *outfile,    /* I - name for output file */
           char *expr,       /* I - column edit expression    */
           int *status)
/*
   modify columns in a table and/or header keywords in the HDU
*/
{
    fitsfile *newptr;
    int ii, hdunum, slen, colnum = -1, testnum, deletecol = 0, savecol = 0;
    int numcols = 0, *colindex = 0, tstatus = 0;
    char *tstbuff=0, *cptr, *cptr2, *cptr3, *clause = NULL, keyname[FLEN_KEYWORD];
    char colname[FLEN_VALUE], oldname[FLEN_VALUE], colformat[FLEN_VALUE];
    char *file_expr = NULL, testname[FLEN_VALUE], card[FLEN_CARD];

    if (*outfile)
    {
      /* create new empty file in to hold the selected rows */
      if (ffinit(&newptr, outfile, status) > 0)
      {
        ffpmsg("failed to create file for copy (ffedit_columns)");
        return(*status);
      }

      fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

      /* copy all HDUs to the output copy, if the 'only_one' flag is not set */
      if (!((*fptr)->Fptr)->only_one) {
        for (ii = 1; 1; ii++)
        {
          if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

          fits_copy_hdu(*fptr, newptr, 0, status);
        }

        if (*status == END_OF_FILE)
        {
          *status = 0;              /* got the expected EOF error; reset = 0  */
        }
        else if (*status > 0)
        {
          ffclos(newptr, status);
          ffpmsg("failed to copy all HDUs from input file (ffedit_columns)");
          return(*status);
        }


      } else {
        /* only copy the primary array and the designated table extension */
	fits_movabs_hdu(*fptr, 1, NULL, status);
	fits_copy_hdu(*fptr, newptr, 0, status);
	fits_movabs_hdu(*fptr, hdunum, NULL, status);
	fits_copy_hdu(*fptr, newptr, 0, status);
        if (*status > 0)
        {
          ffclos(newptr, status);
          ffpmsg("failed to copy all HDUs from input file (ffedit_columns)");
          return(*status);
        }
        hdunum = 2;
      }

      /* close the original file and return ptr to the new image */
      ffclos(*fptr, status);

      *fptr = newptr; /* reset the pointer to the new table */

      /* move back to the selected table HDU */
      if (fits_movabs_hdu(*fptr, hdunum, NULL, status) > 0)
      {
         ffpmsg("failed to copy the input file (ffedit_columns)");
         return(*status);
      }
    }

    /* remove the "col " from the beginning of the column edit expression */
    cptr = expr + 4;

    while (*cptr == ' ')
         cptr++;         /* skip leading white space */
   
    /* Check if need to import expression from a file */

    if( *cptr=='@' ) {
       if( ffimport_file( cptr+1, &file_expr, status ) ) return(*status);
       cptr = file_expr;
       while (*cptr == ' ')
          cptr++;         /* skip leading white space... again */
    }

    tstatus = 0;
    ffgncl(*fptr, &numcols, &tstatus);  /* get initial # of cols */

    /* as of July 2012, the CFITSIO column filter syntax was modified */
    /* so that commas may be used to separate clauses, as well as semi-colons. */
    /* This was done because users cannot enter the semi-colon in the HEASARC's */
    /* Hera on-line data processing system for computer security reasons.  */
    /* Therefore, we must convert those commas back to semi-colons here, but we */
    /* must not convert any columns that occur within parenthesies.  */

    if (comma2semicolon(cptr)) {
         ffpmsg("parsing error in column filter expression");
         ffpmsg(cptr);
         if( file_expr ) free( file_expr );
         *status = PARSE_SYNTAX_ERR;
         return(*status);
    }

    /* parse expression and get first clause, if more than 1 */
    while ((slen = fits_get_token2(&cptr, ";", &clause, NULL, status)) > 0 )
    {
        if( *cptr==';' ) cptr++;
        clause[slen] = '\0';

        if (clause[0] == '!' || clause[0] == '-')
        {
	    char *clause1 = clause+1;
	    int clen = clause1[0] ? strlen(clause1) : 0;
            /* ===================================== */
            /* Case I. delete this column or keyword */
            /* ===================================== */

	    /* Case Ia. delete column names with 0-or-more wildcard
	            -COLNAME+ - delete repeated columns with exact name
		    -COLNAM*+ - delete columns matching patterns
	    */
	    if (*status == 0 &&
		clen > 1 && clause1[0] != '#' &&
		clause1[clen-1] == '+') {

	      clause1[clen-1] = 0; clen--;

	      /* Note that this is a delete 0 or more specification,
		 which means that no matching columns is not an error. */
	      do {
		int status_del = 0;

		/* Have to set status=0 so we can reset the search at
		   start column.  Because we are deleting columns on
		   the fly here, we have to reset the search every
		   time. The only penalty here is execution time
		   because leaving *status == COL_NOT_UNIQUE is merely
		   an optimization for tables assuming the tables do
		   not change from one call to the next. (an
		   assumption broken in this loop) */
		*status = 0; 
		ffgcno(*fptr, CASEINSEN, clause1, &colnum, status);
		/* ffgcno returns COL_NOT_UNIQUE if there are multiple columns,
		   and COL_NOT_FOUND after the last column is found, and 
		   COL_NOT_FOUND if no matches were found */
		if (*status != 0 && *status != COL_NOT_UNIQUE) break;
		
                if (ffdcol(*fptr, colnum, &status_del) > 0) {
		  ffpmsg("failed to delete column in input file:");
		  ffpmsg(clause);
		  if( colindex ) free( colindex );
		  if( file_expr ) free( file_expr );
		  if( clause ) free(clause);
		  return (*status = status_del);
		}
                deletecol = 1; /* set flag that at least one col was deleted */
                numcols--;
	      } while (*status == COL_NOT_UNIQUE);

	      *status = 0; /* No matches are still successful */
	      colnum = -1; /* Ignore the column we found */

	    /* Case Ib. delete column names with wildcard or not
	            -COLNAME  - deleted exact column
		    -COLNAM*  - delete first column that matches pattern
	       Note no leading '#'
	    */
	    } else if (clause1[0] && clause1[0] != '#' &&
		       ((ffgcno(*fptr, CASEINSEN, clause1, &colnum, status) <= 0) ||
			*status == COL_NOT_UNIQUE))
            {
                /* a column with this name exists, so try to delete it */
	        *status = 0; /* Clear potential status=COL_NOT_UNIQUE */
                if (ffdcol(*fptr, colnum, status) > 0)
                {
                    ffpmsg("failed to delete column in input file:");
                    ffpmsg(clause);
                    if( colindex ) free( colindex );
                    if( file_expr ) free( file_expr );
		    if( clause ) free(clause);
                    return(*status);
                }
                deletecol = 1; /* set flag that at least one col was deleted */
                numcols--;
                colnum = -1;
            }
	    /* Case Ic. delete keyword(s)
	            -KEYNAME,#KEYNAME  - delete exact keyword (first match)
		    -KEYNAM*,#KEYNAM*  - delete first matching keyword
		    -KEYNAME+,-#KEYNAME+ - delete 0-or-more exact matches of exact keyword
		    -KEYNAM*+,-#KEYNAM*+ - delete 0-or-more wildcard matches 
	       Note the preceding # is optional if no conflicting column name exists
	       and that wildcard patterns are described in "colfilter" section of
	       documentation.
	    */
            else
            {
	      int delall = 0;
	      int haswild = 0;
	        ffcmsg();   /* clear previous error message from ffgcno */
                /* try deleting a keyword with this name */
                *status = 0;
		/* skip past leading '#' if any */
		if (clause1[0] == '#') clause1++;
		clen = strlen(clause1);

		/* Repeat deletion of keyword if requested with trailing '+' */
		if (clen > 1 && clause1[clen-1] == '+') {
		  delall = 1;
		  clause1[clen-1] = 0;
		}
		/* Determine if this pattern has wildcards */
		if (strchr(clause1,'?') || strchr(clause1,'*') || strchr(clause1,'#')) {
		  haswild = 1;
		}

		if (haswild) {
		  /* ffdkey() behaves differently if the pattern has a wildcard:
		     it only checks from the "current" header position to the end, and doesn't
		     check before the "current" header position.  Therefore, for the
		     case of wildcards we will have to reset to the beginning. */
		  ffmaky(*fptr, 1, status);  /* reset pointer to beginning of header */
		}

		/* Single or repeated deletions until done */
		do {
		  if (ffdkey(*fptr, clause1, status) > 0)
		    {
		      if (delall && *status == KEY_NO_EXIST) {
			/* Found last wildcard item. Stop deleting */
			ffcmsg();
			*status = 0;
			delall = 0; /* Force end of this loop */
		      } else {
			/* This was not a wildcard deletion, or it resulted in
			   another kind of error */
			ffpmsg("column or keyword to be deleted does not exist:");
			ffpmsg(clause1);
			if( colindex ) free( colindex );
			if( file_expr ) free( file_expr );
			if( clause ) free(clause);
			return(*status);
		      }
		    }
		} while(delall); /* end do{} */
            }
        }
        else
        {
            /* ===================================================== */
            /* Case II:
	       this is either a column name, (case 1) 

               or a new column name followed by double = ("==") followed
               by the old name which is to be renamed. (case 2A)

               or a column or keyword name followed by a single "=" and a
	       calculation expression (case 2B) */
            /* ===================================================== */
            cptr2 = clause;
            slen = fits_get_token2(&cptr2, "( =", &tstbuff, NULL, status);

            if (slen == 0 || *status)
            {
                ffpmsg("error: column or keyword name is blank (ffedit_columns):");
                ffpmsg(clause);
                if( colindex ) free( colindex );
                if( file_expr ) free( file_expr );
		if (clause) free(clause);
                if (*status==0)
                   *status=URL_PARSE_ERROR;
                return(*status);
            }
            if (strlen(tstbuff) > FLEN_VALUE-1)
            {
                ffpmsg("error: column or keyword name is too long (ffedit_columns):");
                ffpmsg(clause);
                if( colindex ) free( colindex );
                if( file_expr ) free( file_expr );
		if (clause) free(clause);
                free(tstbuff);
                return(*status= URL_PARSE_ERROR);
            }
            strcpy(colname, tstbuff);
            free(tstbuff);
            tstbuff=0;

	    /* If this is a keyword of the form 
	         #KEYWORD# 
	       then transform to the form
	         #KEYWORDn
	       where n is the previously used column number 
	    */
	    if (colname[0] == '#' &&
		strstr(colname+1, "#") == (colname + strlen(colname) - 1)) 
	    {
		if (colnum <= 0) 
		  {
		    ffpmsg("The keyword name:");
		    ffpmsg(colname);
		    ffpmsg("is invalid unless a column has been previously");
		    ffpmsg("created or editted by a calculator command");
                    if( file_expr ) free( file_expr );
		    if (clause) free(clause);
		    return(*status = URL_PARSE_ERROR);
		  }
		colname[strlen(colname)-1] = '\0';
		/* Make keyword name and put it in oldname */
		ffkeyn(colname+1, colnum, oldname, status);
		if (*status) return (*status);
		/* Re-copy back into colname */
		strcpy(colname+1,oldname);
	    }
            else if  (strstr(colname, "#") == (colname + strlen(colname) - 1)) 
	    {
	        /*  colname is of the form "NAME#";  if
		      a) colnum is defined, and
		      b) a column with literal name "NAME#" does not exist, and
		      c) a keyword with name "NAMEn" (where n=colnum) exists, then
		    transfrom the colname string to "NAMEn", otherwise
		    do nothing.
		*/
		if (colnum > 0) {  /* colnum must be defined */
		  tstatus = 0;
                  ffgcno(*fptr, CASEINSEN, colname, &testnum, &tstatus);
		  if (tstatus != 0 && tstatus != COL_NOT_UNIQUE) 
		  {  
		    /* OK, column doesn't exist, now see if keyword exists */
		    ffcmsg();   /* clear previous error message from ffgcno */
		    strcpy(testname, colname);
 		    testname[strlen(testname)-1] = '\0';
		    /* Make keyword name and put it in oldname */
		    ffkeyn(testname, colnum, oldname, status);
		    if (*status) {
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
		      return (*status);
		    }

		    tstatus = 0;
		    if (!fits_read_card(*fptr, oldname, card, &tstatus)) {
		      /* Keyword does exist; copy real name back into colname */
		      strcpy(colname,oldname);
		    }
		  }
                }
	    }

            /* if we encountered an opening parenthesis, then we need to */
            /* find the closing parenthesis, and concatinate the 2 strings */
            /* This supports expressions like:
                [col #EXTNAME(Extension name)="GTI"]
            */
            if (*cptr2  == '(')
            {
                if (fits_get_token2(&cptr2, ")", &tstbuff, NULL, status)==0)
                {
                   strcat(colname,")");
                }
                else
                {
                   if ((strlen(tstbuff) + strlen(colname) + 1) >
                        FLEN_VALUE-1)
                   {
                      ffpmsg("error: column name is too long (ffedit_columns):");
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
                      free(tstbuff);
                      *status=URL_PARSE_ERROR;
		      return (*status);
                   }
                   strcat(colname, tstbuff);
                   strcat(colname, ")");
                   free(tstbuff);
                   tstbuff=0;
                }
                cptr2++;
            }

            while (*cptr2 == ' ')
                 cptr2++;         /* skip white space */

            if (*cptr2 != '=')
            {
              /* ------------------------------------ */
              /* case 1 - simply the name of a column */
              /* ------------------------------------ */

              /* look for matching column */
              ffgcno(*fptr, CASEINSEN, colname, &testnum, status);
	      
              while (*status == COL_NOT_UNIQUE) 
              {
                 /* the column name contained wild cards, and it */
                 /* matches more than one column in the table. */
		 
		 colnum = testnum;

                 /* keep this column in the output file */
                 savecol = 1;

                 if (!colindex)
                    colindex = (int *) calloc(999, sizeof(int));

                 colindex[colnum - 1] = 1;  /* flag this column number */

                 /* look for other matching column names */
                 ffgcno(*fptr, CASEINSEN, colname, &testnum, status);

                 if (*status == COL_NOT_FOUND)
                    *status = 999;  /* temporary status flag value */
              }

              if (*status <= 0)
              {
	         colnum = testnum;
		 
                 /* keep this column in the output file */
                 savecol = 1;

                 if (!colindex)
                    colindex = (int *) calloc(999, sizeof(int));

                 colindex[colnum - 1] = 1;  /* flag this column number */
              }
              else if (*status == 999)
              {
                  /* this special flag value does not represent an error */
                  *status = 0;  
              }
              else
              {
               ffpmsg("Syntax error in columns specifier in input URL:");
               ffpmsg(cptr2);
               if( colindex ) free( colindex );
               if( file_expr ) free( file_expr );
	       if (clause) free(clause);
               return(*status = URL_PARSE_ERROR);
              }
            }
            else
            {
              /* ----------------------------------------------- */
              /* case 2 where the token ends with an equals sign */
              /* ----------------------------------------------- */

              cptr2++;   /* skip over the first '=' */

              if (*cptr2 == '=')
              {
                /*................................................. */
                /*  Case A:  rename a column or keyword;  syntax is
                    "new_name == old_name"  */
                /*................................................. */

                cptr2++;  /* skip the 2nd '=' */
                while (*cptr2 == ' ')
                      cptr2++;       /* skip white space */

                if (fits_get_token2(&cptr2, " ", &tstbuff, NULL, status)==0)
                {
                   oldname[0]=0;
                }
                else
                {
                   if (strlen(tstbuff) > FLEN_VALUE-1)
                   {
                      ffpmsg("error: column name syntax is too long (ffedit_columns):");
                      if( file_expr ) free( file_expr );
		      if (clause) free(clause);
                      free(tstbuff);
                      *status=URL_PARSE_ERROR;
		      return (*status);
                   }
                   strcpy(oldname, tstbuff);
                   free(tstbuff);
                   tstbuff=0;
                }
                /* get column number of the existing column */
                if (ffgcno(*fptr, CASEINSEN, oldname, &colnum, status) <= 0)
                {
                    /* modify the TTYPEn keyword value with the new name */
                    ffkeyn("TTYPE", colnum, keyname, status);

                    if (ffmkys(*fptr, keyname, colname, NULL, status) > 0)
                    {
                      ffpmsg("failed to rename column in input file");
                      ffpmsg(" oldname =");
                      ffpmsg(oldname);
                      ffpmsg(" newname =");
                      ffpmsg(colname);
                      if( colindex ) free( colindex );
                      if( file_expr ) free( file_expr );
	              if (clause) free(clause);
                      return(*status);
                    }
                    /* keep this column in the output file */
                    savecol = 1;
                    if (!colindex)
                       colindex = (int *) calloc(999, sizeof(int));

                    colindex[colnum - 1] = 1;  /* flag this column number */
                }
                else
                {
                    /* try renaming a keyword */
		    ffcmsg();   /* clear error message stack */
                    *status = 0;
                    if (ffmnam(*fptr, oldname, colname, status) > 0)
                    {
                      ffpmsg("column or keyword to be renamed does not exist:");
                        ffpmsg(clause);
                        if( colindex ) free( colindex );
                        if( file_expr ) free( file_expr );
			if (clause) free(clause);
                        return(*status);
                    }
                }
              }  
              else
              {
                /*...................................................... */
                /* Case B: */
                /* this must be a general column/keyword calc expression */
                /* "name = expression" or "colname(TFORM) = expression" */
                /*...................................................... */

                /* parse the name and TFORM values, if present */
                colformat[0] = '\0';
                cptr3 = colname;

                if (fits_get_token2(&cptr3, "(", &tstbuff, NULL, status)==0)
                {
                   oldname[0]=0;
                }
                else
                {
                   if (strlen(tstbuff) > FLEN_VALUE-1)
                   {
                         ffpmsg("column expression is too long (ffedit_columns)");
                         if( colindex ) free( colindex );
                         if( file_expr ) free( file_expr );
		         if (clause) free(clause);
                         free(tstbuff);
                         *status=URL_PARSE_ERROR;
                         return(*status);
                   }
                   strcpy(oldname, tstbuff);
                   free(tstbuff);
                   tstbuff=0;
                }
                if (cptr3[0] == '(' )
                {
                   cptr3++;  /* skip the '(' */
                   if (fits_get_token2(&cptr3, ")", &tstbuff, NULL, status)==0)
                   {
                      colformat[0]=0;
                   }
                   else
                   {
                      if (strlen(tstbuff) > FLEN_VALUE-1)
                      {
                            ffpmsg("column expression is too long (ffedit_columns)");
                            if( colindex ) free( colindex );
                            if( file_expr ) free( file_expr );
		            if (clause) free(clause);
                            free(tstbuff);
                            *status=URL_PARSE_ERROR;
                            return(*status);
                      }
                      strcpy(colformat, tstbuff);
                      free(tstbuff);
                      tstbuff=0;
                   }
                }

                /* calculate values for the column or keyword */
                /*   cptr2 = the expression to be calculated */
                /*   oldname = name of the column or keyword */
                /*   colformat = column format, or keyword comment string */
                if (fits_calculator(*fptr, cptr2, *fptr, oldname, colformat,
       	                        status) > 0) {
				
                        ffpmsg("Unable to calculate expression");
                        if( colindex ) free( colindex );
                        if( file_expr ) free( file_expr );
			if (clause) free(clause);
                         return(*status);
                }

                /* test if this is a column and not a keyword */
                tstatus = 0;
                ffgcno(*fptr, CASEINSEN, oldname, &testnum, &tstatus);
                if (tstatus == 0)
                {
                    /* keep this column in the output file */
		    colnum = testnum;
                    savecol = 1;

                    if (!colindex)
                      colindex = (int *) calloc(999, sizeof(int));

                    colindex[colnum - 1] = 1;
                    if (colnum > numcols)numcols++;
                }
		else
		{
		   ffcmsg();  /* clear the error message stack */
		}
              }
            }
        }
	if (clause) free(clause);  /* free old clause before getting new one */
        clause = NULL;
    }

    if (savecol && !deletecol)
    {
       /* need to delete all but the specified columns */
       for (ii = numcols; ii > 0; ii--)
       {
         if (!colindex[ii-1])  /* delete this column */
         {
           if (ffdcol(*fptr, ii, status) > 0)
           {
             ffpmsg("failed to delete column in input file:");
             ffpmsg(clause);
             if( colindex ) free( colindex );
             if( file_expr ) free( file_expr );
	     if (clause) free(clause);
             return(*status);
           }
         }
       }
    }

    if( colindex ) free( colindex );
    if( file_expr ) free( file_expr );
    if (clause) free(clause);

    return(*status);
}